

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  CppStringType CVar4;
  int32_t iVar5;
  uint32_t uVar6;
  int iVar7;
  MapFieldBase *this;
  Descriptor *pDVar8;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  size_t sVar9;
  size_t sVar10;
  undefined4 extraout_var;
  uint64_t uVar11;
  EnumValueDescriptor *pEVar12;
  ulong uVar13;
  int64_t iVar14;
  size_t sVar15;
  Message *pMVar16;
  string *value;
  undefined4 extraout_var_00;
  ExtensionSet *this_00;
  Reflection *this_01;
  size_t sVar17;
  size_t j;
  Metadata MVar18;
  MapIterator iter;
  MapIterator end;
  
  MVar18 = Message::GetMetadata(message);
  this_01 = MVar18.reflection;
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    this = Reflection::GetMapData(this_01,message,field);
    bVar2 = MapFieldBase::IsMapValid(this);
    if (bVar2) {
      MapIterator::MapIterator(&iter,message,field);
      MapIterator::MapIterator(&end,message,field);
      pDVar8 = FieldDescriptor::message_type(field);
      field_00 = Descriptor::field(pDVar8,0);
      pDVar8 = FieldDescriptor::message_type(field);
      field_01 = Descriptor::field(pDVar8,1);
      MapFieldBase::MapBegin(this,&iter);
      MapFieldBase::MapEnd(this,&end);
      sVar17 = 0;
      while (bVar2 = protobuf::operator!=(&iter,&end), bVar2) {
        sVar9 = MapKeyDataOnlyByteSize(field_00,&iter.key_);
        sVar10 = MapValueRefDataOnlyByteSize(field_01,&iter.value_.super_MapValueConstRef);
        uVar3 = (int)sVar10 + (int)sVar9 + 2U | 1;
        iVar7 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        sVar17 = sVar17 + sVar10 + sVar9 + 2 + (ulong)(iVar7 * 9 + 0x49U >> 6);
        MapIterator::operator++(&iter);
      }
      MapKey::~MapKey(&end.key_);
      MapKey::~MapKey(&iter.key_);
      return sVar17;
    }
  }
  bVar2 = FieldDescriptor::is_repeated(field);
  if (bVar2) {
    uVar3 = Reflection::FieldSize(this_01,message,field);
    sVar17 = (size_t)uVar3;
  }
  else if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
    bVar2 = Reflection::HasField(this_01,message,field);
    sVar17 = (size_t)bVar2;
  }
  else {
    sVar17 = 1;
  }
  sVar9 = sVar17;
  switch(field->type_) {
  case '\x01':
  case '\x06':
  case '\x10':
    sVar9 = sVar17 << 3;
    break;
  case '\x02':
  case '\a':
  case '\x0f':
    sVar9 = sVar17 << 2;
    break;
  case '\x03':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar13 = Reflection::GetRepeatedInt64(this_01,message,field,(int)sVar10);
        lVar1 = 0x3f;
        if ((uVar13 | 1) != 0) {
          for (; (uVar13 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar1 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar13 = Reflection::GetInt64(this_01,message,field);
    goto LAB_002efaa4;
  case '\x04':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar11 = Reflection::GetRepeatedUInt64(this_01,message,field,(int)sVar10);
        lVar1 = 0x3f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar1 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar13 = Reflection::GetUInt64(this_01,message,field);
    goto LAB_002efaa4;
  case '\x05':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar3 = Reflection::GetRepeatedInt32(this_01,message,field,(int)sVar10);
        lVar1 = 0x3f;
        if ((long)(int)(uVar3 | 1) != 0) {
          for (; (ulong)(long)(int)(uVar3 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar1 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar3 = Reflection::GetInt32(this_01,message,field);
    uVar13 = (ulong)(int)(uVar3 | 1);
    goto LAB_002efaa8;
  case '\b':
    break;
  case '\t':
  case '\f':
    CVar4 = FieldDescriptor::cpp_string_type(field);
    if (CVar4 == kCord) {
      sVar9 = 0;
      while (bVar2 = sVar17 != 0, sVar17 = sVar17 - 1, bVar2) {
        Reflection::GetCord((Reflection *)&iter,(Message *)this_01,(FieldDescriptor *)message);
        sVar10 = WireFormatLite::StringSize((Cord *)&iter);
        sVar9 = sVar9 + sVar10;
        absl::lts_20240722::Cord::~Cord((Cord *)&iter);
      }
    }
    else {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        iter.iter_.node_ = (NodeBase *)&iter.iter_.bucket_index_;
        iter.iter_.m_ = (UntypedMapBase *)0x0;
        iter.iter_.bucket_index_._0_1_ = 0;
        bVar2 = FieldDescriptor::is_repeated(field);
        if (bVar2) {
          value = Reflection::GetRepeatedStringReference
                            (this_01,message,field,(int)sVar10,(string *)&iter);
        }
        else {
          value = Reflection::GetStringReference(this_01,message,field,(string *)&iter);
        }
        sVar15 = WireFormatLite::StringSize(value);
        sVar9 = sVar9 + sVar15;
        std::__cxx11::string::~string((string *)&iter);
      }
    }
    break;
  case '\n':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      pMVar16 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
      iVar7 = (*(pMVar16->super_MessageLite)._vptr_MessageLite[3])(pMVar16);
      return CONCAT44(extraout_var_00,iVar7);
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      pMVar16 = Reflection::GetRepeatedMessage(this_01,message,field,(int)sVar10);
      iVar7 = (*(pMVar16->super_MessageLite)._vptr_MessageLite[3])(pMVar16);
      sVar9 = sVar9 + CONCAT44(extraout_var,iVar7);
    }
    break;
  case '\v':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        pMVar16 = Reflection::GetRepeatedMessage(this_01,message,field,(int)sVar10);
        sVar15 = WireFormatLite::MessageSize<google::protobuf::Message>(pMVar16);
        sVar9 = sVar9 + sVar15;
      }
    }
    else {
      if ((field->field_0x1 & 8) == 0) {
        pMVar16 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
        sVar17 = WireFormatLite::MessageSize<google::protobuf::Message>(pMVar16);
        return sVar17;
      }
      this_00 = Reflection::GetExtensionSet(this_01,message);
      sVar9 = ExtensionSet::GetMessageByteSizeLong(this_00,field->number_);
      uVar3 = (uint)sVar9 | 1;
      iVar7 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      sVar9 = (iVar7 * 9 + 0x49U >> 6) + sVar9;
    }
    break;
  case '\r':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar6 = Reflection::GetRepeatedUInt32(this_01,message,field,(int)sVar10);
        iVar7 = 0x1f;
        if ((uVar6 | 1) != 0) {
          for (; (uVar6 | 1) >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        sVar9 = sVar9 + (iVar7 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar6 = Reflection::GetUInt32(this_01,message,field);
    iVar7 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    goto LAB_002efaac;
  case '\x0e':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        pEVar12 = Reflection::GetRepeatedEnum(this_01,message,field,(int)sVar10);
        uVar13 = (long)pEVar12->number_ | 1;
        lVar1 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar1 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    pEVar12 = Reflection::GetEnum(this_01,message,field);
    uVar13 = (ulong)pEVar12->number_;
LAB_002efaa4:
    uVar13 = uVar13 | 1;
LAB_002efaa8:
    lVar1 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar7 = (int)lVar1;
LAB_002efaac:
    sVar9 = (size_t)(iVar7 * 9 + 0x49U >> 6);
    break;
  case '\x11':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      iVar5 = Reflection::GetInt32(this_01,message,field);
      sVar17 = WireFormatLite::SInt32Size(iVar5);
      return sVar17;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      iVar5 = Reflection::GetRepeatedInt32(this_01,message,field,(int)sVar10);
      sVar15 = WireFormatLite::SInt32Size(iVar5);
      sVar9 = sVar9 + sVar15;
    }
    break;
  case '\x12':
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      iVar14 = Reflection::GetInt64(this_01,message,field);
      sVar17 = WireFormatLite::SInt64Size(iVar14);
      return sVar17;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      iVar14 = Reflection::GetRepeatedInt64(this_01,message,field,(int)sVar10);
      sVar15 = WireFormatLite::SInt64Size(iVar14);
      sVar9 = sVar9 + sVar15;
    }
    break;
  default:
    sVar9 = 0;
  }
  return sVar9;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (size_t j = 0; j < count; j++) {                                  \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)

    case FieldDescriptor::TYPE_MESSAGE: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; ++j) {
          data_size += WireFormatLite::MessageSize(
              message_reflection->GetRepeatedMessage(message, field, j));
        }
        break;
      }
      if (field->is_extension()) {
        data_size += WireFormatLite::LengthDelimitedSize(
            message_reflection->GetExtensionSet(message).GetMessageByteSizeLong(
                field->number()));
        break;
      }
      data_size += WireFormatLite::MessageSize(
          message_reflection->GetMessage(message, field));
      break;
    }

#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        for (size_t j = 0; j < count; j++) {
          absl::Cord value = message_reflection->GetCord(message, field);
          data_size += WireFormatLite::StringSize(value);
        }
        break;
      }
      for (size_t j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}